

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioCtl.cc
# Opt level: O2

void __thiscall AudioCtl::timeShift(AudioCtl *this,int rows)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Audio *pAVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar1 = (this->pos_).super___atomic_base<int>._M_i;
  pAVar4 = this->settings_;
  iVar8 = rows * pAVar4->samples_per_row;
  iVar7 = iVar8 + iVar1;
  iVar2 = this->end_;
  iVar3 = this->start_;
  iVar9 = iVar2 - iVar3;
  iVar6 = iVar7;
  if (iVar7 < iVar3) {
    iVar6 = iVar3;
  }
  iVar7 = (((iVar6 - (iVar7 + (uint)(iVar7 < iVar3))) / (iVar9 + (uint)(iVar9 == 0)) +
           (uint)(iVar7 < iVar3)) * iVar9 + iVar1 + iVar2 + iVar8) - iVar3;
  do {
    iVar7 = iVar7 + (iVar3 - iVar2);
  } while (iVar2 < iVar7);
  LOCK();
  (this->pos_).super___atomic_base<int>._M_i = iVar7;
  UNLOCK();
  lVar5 = (long)pAVar4->samples_per_row;
  aAppDebugPrintf("pos = %d",(long)iVar7 / lVar5 & 0xffffffff,(long)iVar7 % lVar5 & 0xffffffff);
  return;
}

Assistant:

void AudioCtl::timeShift(int rows) noexcept {
	int next_pos = pos_ + rows * settings_.samples_per_row;
	const int loop_length = end_ - start_;
	while (next_pos < start_)
		next_pos += loop_length;
	while (next_pos > end_)
		next_pos -= loop_length;
	pos_ = next_pos;
	MSG("pos = %d", next_pos / settings_.samples_per_row);
}